

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QCss::Declaration>::reallocateAndGrow
          (QArrayDataPointer<QCss::Declaration> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QCss::Declaration> *old)

{
  QArrayData *pQVar1;
  DeclarationData *pDVar2;
  Data *pDVar3;
  Declaration *pDVar4;
  bool bVar5;
  Declaration *pDVar6;
  qsizetype qVar7;
  long lVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QArrayDataPointer<QCss::Declaration> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QCss::Declaration> *)0x0 && where == GrowsAtEnd) {
    pQVar1 = &this->d->super_QArrayData;
    if (pQVar1 == (QArrayData *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = 1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar5)) {
      if (pQVar1 == (QArrayData *)0x0) {
        qVar7 = 0;
        lVar8 = 0;
      }
      else {
        qVar7 = pQVar1->alloc;
        lVar8 = (this->size - pQVar1->alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3);
      }
      auVar9 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,8,qVar7 + n + lVar8,Grow);
      this->d = (Data *)auVar9._0_8_;
      this->ptr = (Declaration *)auVar9._8_8_;
      goto LAB_00375cea;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (Declaration *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar8 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pDVar6 = this->ptr;
    pDVar4 = pDVar6 + lVar8;
    if ((old != (QArrayDataPointer<QCss::Declaration> *)0x0) || (bVar5)) {
      if ((lVar8 != 0) && (0 < lVar8)) {
        do {
          pDVar2 = (pDVar6->d).d.ptr;
          local_38.ptr[local_38.size].d.d.ptr = pDVar2;
          if (pDVar2 != (DeclarationData *)0x0) {
            LOCK();
            (pDVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value = (Type)((int)(pDVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                                    super_QBasicAtomicInteger<int>._q_value + 1);
            UNLOCK();
          }
          pDVar6 = pDVar6 + 1;
          local_38.size = local_38.size + 1;
        } while (pDVar6 < pDVar4);
      }
    }
    else if ((lVar8 != 0) && (0 < lVar8)) {
      do {
        pDVar2 = (pDVar6->d).d.ptr;
        (pDVar6->d).d.ptr = (DeclarationData *)0x0;
        local_38.ptr[local_38.size].d.d.ptr = pDVar2;
        pDVar6 = pDVar6 + 1;
        local_38.size = local_38.size + 1;
      } while (pDVar6 < pDVar4);
    }
  }
  pDVar3 = this->d;
  pDVar4 = this->ptr;
  this->d = local_38.d;
  this->ptr = local_38.ptr;
  qVar7 = this->size;
  this->size = local_38.size;
  local_38.d = pDVar3;
  local_38.ptr = pDVar4;
  local_38.size = qVar7;
  if (old != (QArrayDataPointer<QCss::Declaration> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = pDVar3;
    old->ptr = pDVar4;
    local_38.size = old->size;
    old->size = qVar7;
  }
  ~QArrayDataPointer(&local_38);
LAB_00375cea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }